

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_local_value.hpp
# Opt level: O0

double __thiscall
ylt::metric::thread_local_value<double>::update(thread_local_value<double> *this,double value)

{
  __atomic_float<double> *p_Var1;
  size_type sVar2;
  __pointer_type paVar3;
  vector<std::atomic<std::atomic<double>_*>,_std::allocator<std::atomic<std::atomic<double>_*>_>_>
  *in_RDI;
  thread_local_value<double> *in_XMM0_Qa;
  double dVar4;
  double dVar5;
  size_t i;
  double val;
  size_type sVar6;
  memory_order __m;
  undefined8 local_20;
  size_t in_stack_ffffffffffffffe8;
  
  p_Var1 = &get_value(in_XMM0_Qa,in_stack_ffffffffffffffe8)->super___atomic_float<double>;
  dVar4 = std::__atomic_float<double>::exchange(p_Var1,(double)in_XMM0_Qa,relaxed);
  local_20 = 1;
  while( true ) {
    sVar6 = local_20;
    sVar2 = std::
            vector<std::atomic<std::atomic<double>_*>,_std::allocator<std::atomic<std::atomic<double>_*>_>_>
            ::size(in_RDI);
    if (sVar2 <= sVar6) break;
    std::
    vector<std::atomic<std::atomic<double>_*>,_std::allocator<std::atomic<std::atomic<double>_*>_>_>
    ::operator[](in_RDI,local_20);
    __m = (memory_order)(sVar6 >> 0x20);
    paVar3 = std::atomic::operator_cast_to_atomic_((atomic<std::atomic<double>_*> *)0x275d59);
    if (paVar3 != (__pointer_type)0x0) {
      std::
      vector<std::atomic<std::atomic<double>_*>,_std::allocator<std::atomic<std::atomic<double>_*>_>_>
      ::operator[](in_RDI,local_20);
      p_Var1 = &std::atomic<std::atomic<double>_*>::load
                          ((atomic<std::atomic<double>_*> *)in_RDI,__m)->
                super___atomic_float<double>;
      dVar5 = std::__atomic_float<double>::exchange(p_Var1,0.0,relaxed);
      dVar4 = dVar5 + dVar4;
    }
    local_20 = local_20 + 1;
  }
  return dVar4;
}

Assistant:

value_type update(value_type value = 1) {
    value_type val = get_value(0).exchange(value, std::memory_order::relaxed);
    for (size_t i = 1; i < duplicates_.size(); i++) {
      if (duplicates_[i]) {
        val += duplicates_[i].load()->exchange(0, std::memory_order::relaxed);
      }
    }
    return val;
  }